

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O1

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::directed_flag_complex_in_memory_t
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,directed_graph_t *graph,
          size_t nb_threads,int max_dimension)

{
  pointer *ppdVar1;
  iterator __position;
  long lVar2;
  ostream *poVar3;
  ushort uVar4;
  ulong uVar5;
  vector<std::thread,_std::allocator<std::thread>_> t;
  size_t local_80;
  unsigned_long local_78;
  int local_6c;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> local_68;
  directed_graph_t *local_50;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *local_48;
  _func_void_int_int_directed_flag_complex_in_memory_t<std::pair<int,_float>_>_ptr_directed_graph_t_ptr_int
  *local_40;
  thread local_38;
  
  (this->vertex_cells).
  super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_cells).
  super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_cells).
  super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nb_threads = nb_threads;
  local_80 = nb_threads;
  local_6c = max_dimension;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"constructing the directed flag complex",0x26);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r",1);
  std::
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ::reserve(&this->vertex_cells,(ulong)graph->number_of_vertices);
  if (graph->number_of_vertices != 0) {
    uVar4 = 0;
    do {
      local_68.data.first = 0;
      local_68.data.second = 0.0;
      local_68.children =
           (map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
            *)0x0;
      __position._M_current =
           (this->vertex_cells).
           super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68.vertex = uVar4;
      if (__position._M_current ==
          (this->vertex_cells).
          super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>,std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>>>
        ::_M_realloc_insert<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>>
                  ((vector<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>,std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>>>
                    *)this,__position,&local_68);
      }
      else {
        (__position._M_current)->children =
             (map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
              *)0x0;
        uVar5 = (ulong)CONCAT22(local_68._2_2_,uVar4);
        (__position._M_current)->vertex = (short)uVar5;
        *(short *)&(__position._M_current)->field_0x2 = (short)(uVar5 >> 0x10);
        ((__position._M_current)->data).first = (int)(uVar5 >> 0x20);
        *(ulong *)&((__position._M_current)->data).second = (ulong)(uint)local_68._12_4_ << 0x20;
        ppdVar1 = &(this->vertex_cells).
                   super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppdVar1 = *ppdVar1 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < graph->number_of_vertices);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&local_68,local_80 - 1,
             (allocator_type *)&local_78);
  local_78 = 0;
  if (local_80 != 1) {
    do {
      local_40 = construction_worker_thread<std::pair<int,float>>;
      local_50 = graph;
      local_48 = this;
      std::thread::
      thread<void(*)(int,int,directed_flag_complex_in_memory_t<std::pair<int,float>>*,directed_graph_t_const*,int),unsigned_long_const&,unsigned_long&,directed_flag_complex_in_memory_t<std::pair<int,float>>*,directed_graph_t_const*,int&,void>
                (&local_38,&local_40,&local_80,&local_78,&local_48,&local_50,&local_6c);
      lVar2 = CONCAT44(local_68.data.first,CONCAT22(local_68._2_2_,local_68.vertex));
      if (*(long *)(lVar2 + local_78 * 8) != 0) {
        std::terminate();
      }
      ((id *)(lVar2 + local_78 * 8))->_M_thread = (native_handle_type)local_38._M_id._M_thread;
      local_78 = local_78 + 1;
    } while (local_78 < local_80 - 1);
  }
  construction_worker_thread<std::pair<int,float>>
            ((int)local_80,(int)local_80 + -1,this,graph,local_6c);
  if (local_80 != 1) {
    uVar5 = 0;
    do {
      std::thread::join();
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_80 - 1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&local_68);
  return;
}

Assistant:

directed_flag_complex_in_memory_t<ExtraData>::directed_flag_complex_in_memory_t(const directed_graph_t& graph,
                                                                                const size_t nb_threads,
                                                                                int max_dimension)
    : nb_threads(nb_threads) {
#ifdef INDICATE_PROGRESS
	std::cout << "\033[K"
	          << "constructing the directed flag complex" << std::flush << "\r";
#endif

	// First we add the vertices of the directed flag complex
	vertex_cells.reserve(graph.number_of_vertices);
	for (vertex_index_t index = 0; index < graph.number_of_vertices; index++)
		vertex_cells.push_back(directed_flag_complex_cell_in_memory_t<ExtraData>(index));

	// Now we start a few threads to construct the flag complex
	std::vector<std::thread> t(nb_threads - 1);

	for (auto index = 0ul; index < nb_threads - 1; ++index)
		t[index] = std::thread(&construction_worker_thread<ExtraData>, nb_threads, index, this, &graph, max_dimension);

	// Also do work in this thread, namely the last bit
	// For this last thread, take all the remaining vertices
	construction_worker_thread(nb_threads, nb_threads - 1, this, &graph, max_dimension);

	// Wait until all threads stopped
	for (auto i = 0ul; i < nb_threads - 1; ++i) t[i].join();
}